

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall
wasm::Builder::replaceWithIdenticalType<wasm::RefFunc>(Builder *this,RefFunc *curr)

{
  Type *this_00;
  char cVar1;
  bool bVar2;
  Shareability share;
  BasicType BVar3;
  Expression *pEVar4;
  HeapType type_00;
  RefI31 *expr;
  Const *value_00;
  uintptr_t uVar5;
  Nop *output;
  SmallVector<wasm::Literal,_1UL> local_d0 [56];
  uchar auStack_98 [8];
  array<unsigned_char,_16UL> bytes;
  Type type;
  undefined1 local_68 [8];
  anon_class_16_2_3fee0b3d maybeWrap;
  Literal value;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type;
  uVar5 = (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id;
  local_68 = (undefined1  [8])(bytes._M_elems + 8);
  bytes._M_elems._8_8_ = uVar5;
  maybeWrap.type = (Type *)this;
  if ((uVar5 & 1) != 0 && 6 < uVar5) {
    cVar1 = wasm::Type::isDefaultable();
    uVar5 = this_00->id;
    if (cVar1 != '\0') {
      wasm::Literal::makeZeros((Type)local_d0);
      pEVar4 = makeConstantExpression(this,(Literals *)local_d0);
      pEVar4 = replaceWithIdenticalType<wasm::RefFunc>::anon_class_16_2_3fee0b3d::operator()
                         ((anon_class_16_2_3fee0b3d *)local_68,pEVar4);
      SmallVector<wasm::Literal,_1UL>::~SmallVector(local_d0);
      return pEVar4;
    }
  }
  if (((uint)uVar5 & 3) == 2 && 6 < uVar5) {
    type_00 = Type::getHeapType(this_00);
    expr = (RefI31 *)ExpressionManipulator::refNull<wasm::RefFunc>(curr,type_00);
LAB_0013395b:
    pEVar4 = replaceWithIdenticalType<wasm::RefFunc>::anon_class_16_2_3fee0b3d::operator()
                       ((anon_class_16_2_3fee0b3d *)local_68,(Expression *)expr);
    return pEVar4;
  }
  if ((uVar5 & 1) == 0 && 6 < uVar5) {
    maybeWrap.this = (Builder *)Type::getHeapType(this_00);
    bVar2 = HeapType::isMaybeShared((HeapType *)&maybeWrap.this,i31);
    if (bVar2) {
      value_00 = makeConst<int>(this,0);
      maybeWrap.this = (Builder *)Type::getHeapType(this_00);
      share = wasm::HeapType::getShared();
      expr = makeRefI31(this,(Expression *)value_00,share);
      goto LAB_0013395b;
    }
    uVar5 = this_00->id;
  }
  if (6 < uVar5) {
    return (Expression *)curr;
  }
  maybeWrap.this = (Builder *)0x0;
  BVar3 = Type::getBasic(this_00);
  switch(BVar3) {
  case none:
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = NopId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 0;
    goto LAB_00133ae0;
  case unreachable:
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id = UnreachableId;
    (curr->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression.type.id = 1;
    goto LAB_00133ae0;
  case i32:
    local_38.func.super_IString.str._M_len =
         (ulong)(uint)local_38.func.super_IString.str._M_len._4_4_ << 0x20;
    local_28 = 2;
    wasm::Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case i64:
    local_38.i64 = 0;
    local_28 = 3;
    wasm::Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case f32:
    local_38.func.super_IString.str._M_len =
         (ulong)(uint)local_38.func.super_IString.str._M_len._4_4_ << 0x20;
    local_28 = 4;
    wasm::Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case f64:
    local_38.i64 = 0;
    local_28 = 5;
    wasm::Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  case v128:
    auStack_98[0] = '\0';
    auStack_98[1] = '\0';
    auStack_98[2] = '\0';
    auStack_98[3] = '\0';
    auStack_98[4] = '\0';
    auStack_98[5] = '\0';
    auStack_98[6] = '\0';
    auStack_98[7] = '\0';
    bytes._M_elems[0] = '\0';
    bytes._M_elems[1] = '\0';
    bytes._M_elems[2] = '\0';
    bytes._M_elems[3] = '\0';
    bytes._M_elems[4] = '\0';
    bytes._M_elems[5] = '\0';
    bytes._M_elems[6] = '\0';
    bytes._M_elems[7] = '\0';
    wasm::Literal::Literal((Literal *)&local_38.func,auStack_98);
    wasm::Literal::operator=((Literal *)&maybeWrap.this,(Literal *)&local_38.func);
    break;
  default:
    goto switchD_00133a04_default;
  }
  wasm::Literal::~Literal((Literal *)&local_38.func);
switchD_00133a04_default:
  wasm::Literal::Literal((Literal *)&type,(Literal *)&maybeWrap.this);
  curr = (RefFunc *)makeConst(this,(Literal *)&type);
  wasm::Literal::~Literal((Literal *)&type);
LAB_00133ae0:
  wasm::Literal::~Literal((Literal *)&maybeWrap.this);
  return (Expression *)(Const *)curr;
}

Assistant:

Expression* replaceWithIdenticalType(T* curr) {
    auto type = curr->type;
    // Anything that would otherwise have a more refined type than the original
    // expression needs to be wrapped in a block with the original type.
    auto maybeWrap = [&](Expression* expr) -> Expression* {
      return expr->type == type ? expr : makeBlock({expr}, type);
    };
    if (curr->type.isTuple() && curr->type.isDefaultable()) {
      return maybeWrap(makeConstantExpression(Literal::makeZeros(curr->type)));
    }
    if (curr->type.isNullable()) {
      return maybeWrap(
        ExpressionManipulator::refNull(curr, curr->type.getHeapType()));
    }
    if (curr->type.isRef() &&
        curr->type.getHeapType().isMaybeShared(HeapType::i31)) {
      return maybeWrap(
        makeRefI31(makeConst(0), curr->type.getHeapType().getShared()));
    }
    if (!curr->type.isBasic()) {
      // We can't do any better, keep the original.
      return curr;
    }
    Literal value;
    // TODO: reuse node conditionally when possible for literals
    switch (curr->type.getBasic()) {
      case Type::i32:
        value = Literal(int32_t(0));
        break;
      case Type::i64:
        value = Literal(int64_t(0));
        break;
      case Type::f32:
        value = Literal(float(0));
        break;
      case Type::f64:
        value = Literal(double(0));
        break;
      case Type::v128: {
        std::array<uint8_t, 16> bytes;
        bytes.fill(0);
        value = Literal(bytes.data());
        break;
      }
      case Type::none:
        return ExpressionManipulator::nop(curr);
      case Type::unreachable:
        return ExpressionManipulator::unreachable(curr);
    }
    return makeConst(value);
  }